

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::selectionSort<unsigned_int,reduceDB_c>(uint *array,int size,reduceDB_c lt)

{
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  if (1 < size) {
    puVar2 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
    uVar8 = 1;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar6 = uVar9 & 0xffffffff;
      uVar10 = uVar8;
      do {
        uVar3 = *(ulong *)(puVar2 + array[uVar10]);
        uVar7 = (uint)(uVar3 >> 5) & 0x1ffffff;
        uVar4 = *(ulong *)(puVar2 + array[(int)uVar6]);
        uVar11 = (uint)(uVar4 >> 5) & 0x1ffffff;
        bVar5 = uVar11 < uVar7;
        if (uVar7 == uVar11) {
          bVar5 = (uint)(uVar4 >> 0x22) < (uint)(uVar3 >> 0x22);
        }
        uVar3 = uVar10 & 0xffffffff;
        if (!bVar5) {
          uVar3 = uVar6;
        }
        uVar6 = uVar3;
        uVar10 = uVar10 + 1;
      } while ((uint)size != uVar10);
      uVar7 = array[uVar9];
      array[uVar9] = array[(int)uVar6];
      array[(int)uVar6] = uVar7;
      uVar8 = uVar8 + 1;
      uVar9 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}